

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvRoberts_dns_negsol.c
# Opt level: O2

void PrintFinalStats(void *cvode_mem)

{
  long netf;
  long nnf;
  long nni;
  long nsetups;
  long nfe;
  long nst;
  int retval;
  long ncfn;
  long nfeLS;
  long nje;
  
  retval = CVodeGetNumSteps(cvode_mem,&nst);
  check_retval(&retval,"CVodeGetNumSteps",1);
  retval = CVodeGetNumRhsEvals(cvode_mem,&nfe);
  check_retval(&retval,"CVodeGetNumRhsEvals",1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem,&nsetups);
  check_retval(&retval,"CVodeGetNumLinSolvSetups",1);
  retval = CVodeGetNumErrTestFails(cvode_mem,&netf);
  check_retval(&retval,"CVodeGetNumErrTestFails",1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem,&nni);
  check_retval(&retval,"CVodeGetNumNonlinSolvIters",1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem,&nnf);
  check_retval(&retval,"CVodeGetNumNonlinSolvConvFails",1);
  retval = CVodeGetNumStepSolveFails(cvode_mem,&ncfn);
  check_retval(&retval,"CVodeGetNumStepSolveFails",1);
  retval = CVodeGetNumJacEvals(cvode_mem,&nje);
  check_retval(&retval,"CVodeGetNumJacEvals",1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem,&nfeLS);
  check_retval(&retval,"CVodeGetNumLinRhsEvals",1);
  puts("\nFinal Statistics:");
  printf("nst = %-6ld nfe = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",nst,nfe,nsetups,nfeLS,
         nje);
  printf("nni = %-6ld nnf = %-6ld netf = %-6ld    ncfn = %-6ld\n\n",nni,nnf,netf,ncfn);
  return;
}

Assistant:

static void PrintFinalStats(void* cvode_mem)
{
  long int nst, nfe, nsetups, nje, nfeLS, nni, nnf, ncfn, netf;
  int retval;

  retval = CVodeGetNumSteps(cvode_mem, &nst);
  check_retval(&retval, "CVodeGetNumSteps", 1);
  retval = CVodeGetNumRhsEvals(cvode_mem, &nfe);
  check_retval(&retval, "CVodeGetNumRhsEvals", 1);
  retval = CVodeGetNumLinSolvSetups(cvode_mem, &nsetups);
  check_retval(&retval, "CVodeGetNumLinSolvSetups", 1);
  retval = CVodeGetNumErrTestFails(cvode_mem, &netf);
  check_retval(&retval, "CVodeGetNumErrTestFails", 1);
  retval = CVodeGetNumNonlinSolvIters(cvode_mem, &nni);
  check_retval(&retval, "CVodeGetNumNonlinSolvIters", 1);
  retval = CVodeGetNumNonlinSolvConvFails(cvode_mem, &nnf);
  check_retval(&retval, "CVodeGetNumNonlinSolvConvFails", 1);
  retval = CVodeGetNumStepSolveFails(cvode_mem, &ncfn);
  check_retval(&retval, "CVodeGetNumStepSolveFails", 1);

  retval = CVodeGetNumJacEvals(cvode_mem, &nje);
  check_retval(&retval, "CVodeGetNumJacEvals", 1);
  retval = CVodeGetNumLinRhsEvals(cvode_mem, &nfeLS);
  check_retval(&retval, "CVodeGetNumLinRhsEvals", 1);

  printf("\nFinal Statistics:\n");
  printf("nst = %-6ld nfe = %-6ld nsetups = %-6ld nfeLS = %-6ld nje = %ld\n",
         nst, nfe, nsetups, nfeLS, nje);
  printf("nni = %-6ld nnf = %-6ld netf = %-6ld    ncfn = %-6ld\n\n", nni, nnf,
         netf, ncfn);
}